

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O2

char * google::protobuf::internal::TcParser::MpString<false>
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  ushort uVar1;
  bool bVar2;
  uint uVar3;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 table_00;
  char *pcVar4;
  TailCallParseFunc UNRECOVERED_JUMPTABLE;
  ushort *puVar5;
  Cord *cord;
  Cord **ppCVar6;
  MicroString *str;
  string *s;
  ulong uVar7;
  uint *puVar8;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 ctx_00;
  Arena *pAVar9;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar10;
  ParseContext *extraout_RDX;
  ParseContext *entry;
  ParseContext *extraout_RDX_00;
  ParseContext *extraout_RDX_01;
  ParseContext *ctx_01;
  uint16_t xform_val;
  uint64_t uVar11;
  ushort uVar12;
  string_view sVar13;
  string_view wire_bytes;
  ushort local_4c;
  
  uVar11 = hasbits;
  table_00 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
             RefAt<google::protobuf::internal::TcParseTableBase::FieldEntry>
                       (table,(ulong)data.field_0 >> 0x20);
  xform_val = (uint16_t)uVar11;
  if ((data.field_0._0_4_ & 7) != 2) {
    UNRECOVERED_JUMPTABLE = table->fallback;
    goto LAB_001cfa2e;
  }
  uVar1 = *(uint16_t *)(table_00.data + 10);
  uVar12 = uVar1 & 0x30;
  if (uVar12 == 0x20) {
    pcVar4 = MpRepeatedString<false>(msg,ptr,ctx,data,table,hasbits);
    return pcVar4;
  }
  ctx_00._0_4_ = uVar1 & 0x600;
  ctx_00.data._4_4_ = 0;
  aVar10 = ctx_00;
  if (uVar12 == 0x10) {
    anon_unknown_105::SetHas((FieldEntry *)table_00,msg);
LAB_001cfa93:
    bVar2 = false;
  }
  else {
    if (uVar12 != 0x30) goto LAB_001cfa93;
    bVar2 = ChangeOneof(table,(FieldEntry *)table_00,data.field_0._0_4_ >> 3,(ParseContext *)ctx_00,
                        msg);
  }
  local_4c = (ushort)ctx_00._0_4_;
  if ((uVar1 & 0x1c0) == 0x140) {
    str = RefAt<google::protobuf::internal::MicroString>(msg,(ulong)*(uint *)table_00);
    if (bVar2 != false) {
      str->rep_ = (void *)0x0;
    }
    pAVar9 = (Arena *)(msg->_internal_metadata_).ptr_;
    if (((ulong)pAVar9 & 1) != 0) {
      pAVar9 = *(Arena **)((ulong)pAVar9 & 0xfffffffffffffffe);
    }
    puVar5 = (ushort *)
             EpsCopyInputStream::ReadMicroString(&ctx->super_EpsCopyInputStream,ptr,str,pAVar9);
    sVar13 = MicroString::Get(str);
LAB_001cfc10:
    wire_bytes._M_len = (TcParseTableBase *)sVar13._M_str;
    wire_bytes._M_str = (char *)table;
    bVar2 = MpVerifyUtf8((TcParser *)sVar13._M_len,wire_bytes,(TcParseTableBase *)table_00,
                         (FieldEntry *)(ulong)local_4c,xform_val);
    aVar10 = table_00;
    ctx_01 = extraout_RDX;
  }
  else {
    if ((uVar1 & 0x1c0) != 0x80) {
      if ((uVar1 & 0x1c0) != 0) {
        Unreachable("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                    ,0x967);
      }
      wire_bytes._M_len =
           (TcParseTableBase *)
           RefAt<google::protobuf::internal::ArenaStringPtr>(msg,(ulong)*(uint *)table_00);
      if (bVar2 != false) {
        *(undefined8 **)wire_bytes._M_len = &fixed_address_empty_string;
      }
      aVar10 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)(msg->_internal_metadata_).ptr_;
      if ((aVar10.data & 1) != 0) {
        aVar10 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                 ((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)(aVar10.data & 0xfffffffffffffffe))->
                 data;
      }
      if ((Arena *)aVar10.data == (Arena *)0x0) {
        s = ArenaStringPtr::MutableNoCopy_abi_cxx11_
                      ((ArenaStringPtr *)wire_bytes._M_len,(Arena *)0x0);
        puVar5 = (ushort *)InlineGreedyStringParser(s,ptr,ctx);
      }
      else {
        puVar5 = (ushort *)
                 EpsCopyInputStream::ReadArenaString
                           (&ctx->super_EpsCopyInputStream,ptr,(ArenaStringPtr *)wire_bytes._M_len,
                            (Arena *)aVar10);
      }
      if (puVar5 == (ushort *)0x0) {
        anon_unknown_105::EnsureArenaStringIsNotDefault(msg,(ArenaStringPtr *)wire_bytes._M_len);
        ctx_01 = extraout_RDX_01;
        ptr = (char *)wire_bytes._M_len;
        goto LAB_001cfce4;
      }
      sVar13._M_str = *(char **)((ulong)*(void **)wire_bytes._M_len & 0xfffffffffffffffc);
      sVar13._M_len = ((undefined8 *)((ulong)*(void **)wire_bytes._M_len & 0xfffffffffffffffc))[1];
      goto LAB_001cfc10;
    }
    if (uVar12 == 0x30) {
      if (bVar2 == false) {
        ppCVar6 = RefAt<absl::lts_20250127::Cord*>(msg,(ulong)*(uint *)table_00);
        cord = *ppCVar6;
      }
      else {
        pAVar9 = (Arena *)(msg->_internal_metadata_).ptr_;
        if (((ulong)pAVar9 & 1) != 0) {
          pAVar9 = *(Arena **)((ulong)pAVar9 & 0xfffffffffffffffe);
        }
        cord = Arena::Create<absl::lts_20250127::Cord>(pAVar9);
        ppCVar6 = RefAt<absl::lts_20250127::Cord*>(msg,(ulong)*(uint *)table_00);
        *ppCVar6 = cord;
      }
    }
    else {
      cord = RefAt<absl::lts_20250127::Cord>(msg,(ulong)*(uint *)table_00);
    }
    puVar5 = (ushort *)InlineCordParser(cord,ptr,ctx);
    ctx_01 = entry;
    if (puVar5 == (ushort *)0x0) goto LAB_001cfce4;
    aVar10.data._2_6_ = 0;
    aVar10.data._0_2_ = local_4c;
    MpVerifyUtf8(cord,(TcParseTableBase *)ptr,(FieldEntry *)entry,local_4c);
    bVar2 = true;
    ctx_01 = extraout_RDX_00;
    wire_bytes._M_len = (TcParseTableBase *)ptr;
  }
  ptr = (char *)wire_bytes._M_len;
  if ((bVar2 != false) && (puVar5 != (ushort *)0x0)) {
    if ((ctx->super_EpsCopyInputStream).limit_end_ <= puVar5) {
      if ((ulong)table->has_bits_offset != 0) {
        puVar8 = RefAt<unsigned_int>(msg,(ulong)table->has_bits_offset);
        *puVar8 = *puVar8 | (uint)hasbits;
      }
      return (char *)puVar5;
    }
    uVar3 = (uint)table->fast_idx_mask & (uint)*puVar5;
    if ((uVar3 & 7) != 0) {
      protobuf_assumption_failed
                ("(idx & 7) == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                 ,0x452);
    }
    uVar7 = (ulong)(uVar3 & 0xfffffff8);
    data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                   ((ulong)*puVar5 ^ *(ulong *)(&table[1].fast_idx_mask + uVar7 * 2));
    UNRECOVERED_JUMPTABLE = *(TailCallParseFunc *)(&table[1].has_bits_offset + uVar7);
    ptr = (char *)puVar5;
LAB_001cfa2e:
    pcVar4 = (*UNRECOVERED_JUMPTABLE)(msg,ptr,ctx,data,table,hasbits);
    return pcVar4;
  }
LAB_001cfce4:
  pcVar4 = Error(msg,ptr,ctx_01,(TcFieldData)aVar10,table,hasbits);
  return pcVar4;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::MpString(PROTOBUF_TC_PARAM_DECL) {
  const auto& entry = RefAt<FieldEntry>(table, data.entry_offset());
  const uint16_t type_card = entry.type_card;
  const uint16_t card = type_card & field_layout::kFcMask;
  const uint32_t decoded_wiretype = data.tag() & 7;

  if (decoded_wiretype != WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
    PROTOBUF_MUSTTAIL return table->fallback(PROTOBUF_TC_PARAM_PASS);
  }
  if (card == field_layout::kFcRepeated) {
    PROTOBUF_MUSTTAIL return MpRepeatedString<is_split>(PROTOBUF_TC_PARAM_PASS);
  }
  const uint16_t xform_val = type_card & field_layout::kTvMask;
  const uint16_t rep = type_card & field_layout::kRepMask;

  // Mark the field as present:
  const bool is_oneof = card == field_layout::kFcOneof;
  bool need_init = false;
  if (card == field_layout::kFcOptional) {
    SetHas(entry, msg);
  } else if (is_oneof) {
    need_init = ChangeOneof(table, entry, data.tag() >> 3, ctx, msg);
  }

  bool is_valid = false;
  void* const base = MaybeGetSplitBase(msg, is_split, table);
  switch (rep) {
    case field_layout::kRepAString: {
      auto& field = RefAt<ArenaStringPtr>(base, entry.offset);
      if (need_init) field.InitDefault();
      Arena* arena = msg->GetArena();
      if (arena) {
        ptr = ctx->ReadArenaString(ptr, &field, arena);
      } else {
        std::string* str = field.MutableNoCopy(nullptr);
        ptr = InlineGreedyStringParser(str, ptr, ctx);
      }
      if (ABSL_PREDICT_FALSE(ptr == nullptr)) {
        EnsureArenaStringIsNotDefault(msg, &field);
        break;
      }
      is_valid = MpVerifyUtf8(field.Get(), table, entry, xform_val);
      break;
    }

    case field_layout::kRepMString: {
      auto& field = RefAt<MicroString>(base, entry.offset);
      if (need_init) field.InitDefault();
      ptr = ctx->ReadMicroString(ptr, field, msg->GetArena());
      is_valid = MpVerifyUtf8(field.Get(), table, entry, xform_val);
      break;
    }


    case field_layout::kRepCord: {
      absl::Cord* field;
      if (is_oneof) {
        if (need_init) {
          field = Arena::Create<absl::Cord>(msg->GetArena());
          RefAt<absl::Cord*>(msg, entry.offset) = field;
        } else {
          field = RefAt<absl::Cord*>(msg, entry.offset);
        }
      } else {
        field = &RefAt<absl::Cord>(base, entry.offset);
      }
      ptr = InlineCordParser(field, ptr, ctx);
      if (!ptr) break;
      is_valid = MpVerifyUtf8(*field, table, entry, xform_val);
      break;
    }

    default:
      Unreachable();
  }

  if (ABSL_PREDICT_FALSE(ptr == nullptr || !is_valid)) {
    PROTOBUF_MUSTTAIL return Error(PROTOBUF_TC_PARAM_NO_DATA_PASS);
  }
  PROTOBUF_MUSTTAIL return ToTagDispatch(PROTOBUF_TC_PARAM_NO_DATA_PASS);
}